

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O3

CpuTime muduo::ProcessInfo::cpuTime(void)

{
  undefined1 auVar1 [16];
  clock_t cVar2;
  undefined1 auVar3 [16];
  CpuTime CVar4;
  tms tms;
  tms local_28;
  
  cVar2 = times(&local_28);
  if (cVar2 < 0) {
    CVar4 = (CpuTime)ZEXT816(0);
  }
  else {
    auVar3._0_8_ = (double)local_28.tms_utime;
    auVar3._8_8_ = (double)local_28.tms_stime;
    auVar1._8_8_ = (double)detail::g_clockTicks;
    auVar1._0_8_ = (double)detail::g_clockTicks;
    CVar4 = (CpuTime)divpd(auVar3,auVar1);
  }
  return CVar4;
}

Assistant:

ProcessInfo::CpuTime ProcessInfo::cpuTime()
{
  ProcessInfo::CpuTime t;
  struct tms tms;
  if (::times(&tms) >= 0)
  {
    const double hz = static_cast<double>(clockTicksPerSecond());
    t.userSeconds = static_cast<double>(tms.tms_utime) / hz;
    t.systemSeconds = static_cast<double>(tms.tms_stime) / hz;
  }
  return t;
}